

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_shift_imm(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  _Bool _Var2;
  uint rd;
  uint uVar3;
  MemOp memop;
  TCGv_i64 pTVar4;
  TCGv_i64 pTVar5;
  TCGv_i64 pTVar6;
  byte bVar7;
  int shift;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  int64_t shift_00;
  GVecGen2i_conflict1 *gvec_op;
  uint immb;
  uint uVar13;
  MemOp MVar14;
  int in_stack_ffffffffffffff58;
  TCGv_i64 local_48;
  
  uVar13 = insn >> 0x13 & 0xf;
  if (uVar13 == 0) {
    __assert_fail("immh != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x29a6,"void disas_simd_shift_imm(DisasContext *, uint32_t)");
  }
  uVar8 = insn >> 0xb & 0x1f;
  if (0x1f < uVar8) goto switchD_0063817e_caseD_1;
  rd = insn & 0x1f;
  uVar3 = insn >> 5 & 0x1f;
  immb = insn >> 0x10 & 7;
  uVar11 = insn & 0x20000000;
  uVar10 = insn & 0x40000000;
  switch(uVar8) {
  case 0:
  case 2:
  case 4:
  case 6:
    goto switchD_0063817e_caseD_0;
  case 8:
    if (uVar11 == 0) break;
switchD_0063817e_caseD_0:
    pTVar1 = s->uc->tcg_ctx;
    MVar14 = MO_ALIGN_2|MO_BESL|MO_16;
    if (uVar13 != 0) {
      for (; uVar13 >> MVar14 == 0; MVar14 = MVar14 - MO_16) {
      }
    }
    bVar7 = (byte)MVar14;
    iVar9 = 8 << (bVar7 & 0x1f);
    pTVar4 = new_tmp_a64_aarch64(s);
    pTVar5 = new_tmp_a64_aarch64(s);
    if ((insn & 0x40400000) != 0x400000) {
      _Var2 = fp_access_check(s);
      if (!_Var2) {
        return;
      }
      if (8 < uVar8) {
switchD_0063823f_caseD_1:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x2900,(char *)0x0);
      }
      shift = (0x10 << (bVar7 & 0x1f)) - (immb + uVar13 * 8);
      switch(uVar8) {
      case 0:
        if (uVar11 == 0) {
          tcg_gen_gvec_sari_aarch64
                    (s->uc->tcg_ctx,MVar14,rd * 0x100 + 0xc10,uVar3 * 0x100 + 0xc10,
                     (long)(int)(shift - (uint)(shift == iVar9)),(uint)(uVar10 != 0) * 8 + 8,
                     s->sve_len);
          return;
        }
        if (shift != iVar9) {
          tcg_gen_gvec_shri_aarch64
                    (s->uc->tcg_ctx,MVar14,rd * 0x100 + 0xc10,uVar3 * 0x100 + 0xc10,(long)shift,
                     (uint)(uVar10 != 0) * 8 + 8,s->sve_len);
          return;
        }
        tcg_gen_gvec_dup8i_aarch64
                  (pTVar1,rd * 0x100 + 0xc10,(uint)(uVar10 != 0) * 8 + 8,s->sve_len,'\0');
        return;
      default:
        goto switchD_0063823f_caseD_1;
      case 2:
        if (uVar11 == 0) {
          shift_00 = (int64_t)(int)(shift - (uint)(shift == iVar9));
          gvec_op = ssra_op_aarch64 + MVar14;
        }
        else {
          if (shift == iVar9) goto LAB_006388bb;
          shift_00 = (int64_t)shift;
          gvec_op = usra_op_aarch64 + MVar14;
        }
LAB_00638953:
        gen_gvec_op2i(s,uVar10 != 0,rd,uVar3,shift_00,gvec_op);
        return;
      case 4:
        _Var2 = false;
        break;
      case 6:
        _Var2 = true;
        break;
      case 8:
        if (shift != iVar9) {
          shift_00 = (int64_t)shift;
          gvec_op = sri_op_aarch64 + MVar14;
          goto LAB_00638953;
        }
        goto LAB_006388bb;
      }
      memop = uVar11 >> 0x1b ^ MO_ASHIFT | MVar14;
      pTVar6 = tcg_const_i64_aarch64(pTVar1,1L << ((char)shift - 1U & 0x3f));
      for (uVar13 = 0; (uint)(uVar10 != 0) * 0x40 + 0x40 >> (0x22 - (bVar7 ^ 0x1f) & 0x1f) != uVar13
          ; uVar13 = uVar13 + 1) {
        read_vec_element(s,pTVar4,uVar3,uVar13,memop);
        if (_Var2 != false) {
          read_vec_element(s,pTVar5,rd,uVar13,memop);
        }
        handle_shri_with_rndacc(pTVar1,pTVar5,pTVar4,pTVar6,_Var2,uVar11 != 0,MVar14,shift);
        write_vec_element(s,pTVar5,rd,uVar13,MVar14);
      }
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar6 + (long)pTVar1));
LAB_006388bb:
      clear_vec_high(s,uVar10 != 0,rd);
      return;
    }
    goto LAB_0063859e;
  case 10:
    uVar8 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    if ((insn & 0x40400000) != 0x400000) {
      _Var2 = fp_access_check(s);
      if (!_Var2) {
        return;
      }
      shift_00 = (int64_t)(int)(immb + uVar13 * 8 + (-8 << ((byte)uVar8 & 0x1f)));
      if (uVar11 == 0) {
        tcg_gen_gvec_shli_aarch64
                  (s->uc->tcg_ctx,uVar8,rd * 0x100 + 0xc10,uVar3 * 0x100 + 0xc10,shift_00,
                   (uint)(uVar10 != 0) * 8 + 8,s->sve_len);
        return;
      }
      gvec_op = sli_op_aarch64 + uVar8;
      goto LAB_00638953;
    }
    break;
  case 0xc:
    if (uVar11 != 0) {
      bVar12 = true;
      _Var2 = false;
      goto LAB_0063844a;
    }
    break;
  case 0xe:
    _Var2 = uVar11 != 0;
    bVar12 = _Var2;
LAB_0063844a:
    handle_simd_qshl(s,false,uVar10 != 0,_Var2,bVar12,uVar13,immb,uVar3,rd);
    return;
  case 0x10:
  case 0x11:
    if (uVar11 != 0) {
      bVar12 = true;
      _Var2 = false;
      goto LAB_006382cb;
    }
    uVar8 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    bVar7 = 0x22 - (char)(uVar8 ^ 0x1f);
    if ((insn >> 0x16 & 1) == 0) {
      pTVar1 = s->uc->tcg_ctx;
      _Var2 = fp_access_check(s);
      if (!_Var2) {
        return;
      }
      iVar9 = (0x10 << ((byte)uVar8 & 0x1f)) - (immb + uVar13 * 8);
      pTVar4 = tcg_temp_new_i64(pTVar1);
      pTVar5 = tcg_temp_new_i64(pTVar1);
      pTVar6 = tcg_temp_new_i64(pTVar1);
      read_vec_element(s,pTVar6,rd,uVar10 >> 0x1e,MO_64);
      uVar13 = 0;
      if ((insn >> 0xb & 1) == 0) {
        local_48 = (TCGv_i64)0x0;
      }
      else {
        local_48 = tcg_const_i64_aarch64(pTVar1,1L << ((char)iVar9 - 1U & 0x3f));
      }
      MVar14 = MO_ALIGN_4 - (uVar8 ^ 0x1f);
      for (; 0x40U >> (bVar7 & 0x1f) != uVar13; uVar13 = uVar13 + 1) {
        read_vec_element(s,pTVar4,uVar3,uVar13,MVar14);
        handle_shri_with_rndacc(pTVar1,pTVar5,pTVar4,local_48,false,true,MVar14,iVar9);
        tcg_gen_deposit_i64_aarch64
                  (pTVar1,pTVar6,pTVar6,pTVar5,uVar13 << (bVar7 & 0x1f),8 << ((byte)uVar8 & 0x1f));
      }
      write_vec_element(s,pTVar6,rd,uVar10 >> 0x1e,MO_64);
      if ((insn >> 0xb & 1) != 0) {
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(local_48 + (long)pTVar1));
      }
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar4 + (long)pTVar1));
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar5 + (long)pTVar1));
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar6 + (long)pTVar1));
      goto LAB_006388bb;
    }
    break;
  case 0x12:
  case 0x13:
    _Var2 = uVar11 != 0;
    bVar12 = _Var2;
LAB_006382cb:
    handle_vec_simd_sqshrn(s,false,uVar10 != 0,_Var2,bVar12,uVar13,immb,uVar8,uVar3,rd);
    return;
  case 0x14:
    pTVar1 = s->uc->tcg_ctx;
    uVar8 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    bVar7 = 0x22 - (char)(uVar8 ^ 0x1f);
    pTVar4 = new_tmp_a64_aarch64(s);
    pTVar5 = new_tmp_a64_aarch64(s);
    if (uVar13 < 8) {
      _Var2 = fp_access_check(s);
      if (!_Var2) {
        return;
      }
      read_vec_element(s,pTVar4,uVar3,uVar10 >> 0x1e,MO_64);
      for (uVar3 = 0; 0x40U >> (bVar7 & 0x1f) != uVar3; uVar3 = uVar3 + 1) {
        tcg_gen_shri_i64_aarch64(pTVar1,pTVar5,pTVar4,(long)(int)(uVar3 << (bVar7 & 0x1f)));
        ext_and_shift_reg(pTVar1,pTVar5,pTVar5,uVar8 | uVar11 >> 0x1b ^ 4,0);
        tcg_gen_shli_i64_aarch64
                  (pTVar1,pTVar5,pTVar5,
                   (long)(int)(immb + uVar13 * 8 + (-8 << ((byte)uVar8 & 0x1f))));
        write_vec_element(s,pTVar5,rd,uVar3,MO_ALIGN_4 - (uVar8 ^ 0x1f));
      }
      return;
    }
    goto LAB_0063859e;
  case 0x1c:
    handle_simd_shift_intfp_conv
              (s,false,uVar10 != 0,uVar11 != 0,uVar13,immb,uVar3,rd,in_stack_ffffffffffffff58);
    return;
  case 0x1f:
    handle_simd_shift_fpint_conv(s,false,uVar10 != 0,uVar11 != 0,uVar13,immb,uVar3,rd);
    return;
  }
switchD_0063817e_caseD_1:
LAB_0063859e:
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_simd_shift_imm(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 5);
    int immb = extract32(insn, 16, 3);
    int immh = extract32(insn, 19, 4);
    bool is_u = extract32(insn, 29, 1);
    bool is_q = extract32(insn, 30, 1);

    /* data_proc_simd[] has sent immh == 0 to disas_simd_mod_imm. */
    assert(immh != 0);

    switch (opcode) {
    case 0x08: /* SRI */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x00: /* SSHR / USHR */
    case 0x02: /* SSRA / USRA (accumulate) */
    case 0x04: /* SRSHR / URSHR (rounding) */
    case 0x06: /* SRSRA / URSRA (accum + rounding) */
        handle_vec_simd_shri(s, is_q, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x0a: /* SHL / SLI */
        handle_vec_simd_shli(s, is_q, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x10: /* SHRN */
    case 0x11: /* RSHRN / SQRSHRUN */
        if (is_u) {
            handle_vec_simd_sqshrn(s, false, is_q, false, true, immh, immb,
                                   opcode, rn, rd);
        } else {
            handle_vec_simd_shrn(s, is_q, immh, immb, opcode, rn, rd);
        }
        break;
    case 0x12: /* SQSHRN / UQSHRN */
    case 0x13: /* SQRSHRN / UQRSHRN */
        handle_vec_simd_sqshrn(s, false, is_q, is_u, is_u, immh, immb,
                               opcode, rn, rd);
        break;
    case 0x14: /* SSHLL / USHLL */
        handle_vec_simd_wshli(s, is_q, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x1c: /* SCVTF / UCVTF */
        handle_simd_shift_intfp_conv(s, false, is_q, is_u, immh, immb,
                                     opcode, rn, rd);
        break;
    case 0xc: /* SQSHLU */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        handle_simd_qshl(s, false, is_q, false, true, immh, immb, rn, rd);
        break;
    case 0xe: /* SQSHL, UQSHL */
        handle_simd_qshl(s, false, is_q, is_u, is_u, immh, immb, rn, rd);
        break;
    case 0x1f: /* FCVTZS/ FCVTZU */
        handle_simd_shift_fpint_conv(s, false, is_q, is_u, immh, immb, rn, rd);
        return;
    default:
        unallocated_encoding(s);
        return;
    }
}